

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O2

void __thiscall
Assimp::D3MF::OpcPackageRelationshipReader::ParseChildNode
          (OpcPackageRelationshipReader *this,XmlReader *xmlReader)

{
  OpcPackageRelationship *this_00;
  OpcPackageRelationshipPtr relPtr;
  
  this_00 = (OpcPackageRelationship *)operator_new(0x60);
  (this_00->id)._M_dataplus._M_p = (pointer)0x0;
  (this_00->id)._M_string_length = 0;
  (this_00->id).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->id).field_2 + 8) = 0;
  (this_00->type)._M_dataplus._M_p = (pointer)0x0;
  (this_00->type)._M_string_length = 0;
  (this_00->type).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->type).field_2 + 8) = 0;
  (this_00->target)._M_dataplus._M_p = (pointer)0x0;
  (this_00->target)._M_string_length = 0;
  (this_00->target).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->target).field_2 + 8) = 0;
  OpcPackageRelationship::OpcPackageRelationship(this_00);
  std::__shared_ptr<Assimp::D3MF::OpcPackageRelationship,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::D3MF::OpcPackageRelationship,void>
            ((__shared_ptr<Assimp::D3MF::OpcPackageRelationship,(__gnu_cxx::_Lock_policy)2> *)
             &relPtr,this_00);
  (*xmlReader->_vptr_IIrrXMLReader[8])(xmlReader,XmlTag::RELS_ATTRIB_ID_abi_cxx11_);
  std::__cxx11::string::assign
            ((char *)relPtr.
                     super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  (*xmlReader->_vptr_IIrrXMLReader[8])(xmlReader,XmlTag::RELS_ATTRIB_TYPE_abi_cxx11_);
  std::__cxx11::string::assign
            ((char *)&(relPtr.
                       super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->type);
  (*xmlReader->_vptr_IIrrXMLReader[8])(xmlReader,XmlTag::RELS_ATTRIB_TARGET_abi_cxx11_);
  std::__cxx11::string::assign
            ((char *)&(relPtr.
                       super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->target);
  if (((((relPtr.
          super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->id)._M_string_length != 0) &&
      (((relPtr.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->type)._M_string_length != 0)) &&
     (((relPtr.super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->target)._M_string_length != 0)) {
    std::
    vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
    ::push_back(&this->m_relationShips,&relPtr);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&relPtr.
              super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void ParseChildNode(XmlReader* xmlReader) {        
        OpcPackageRelationshipPtr relPtr(new OpcPackageRelationship());

        relPtr->id = xmlReader->getAttributeValueSafe(XmlTag::RELS_ATTRIB_ID.c_str());
        relPtr->type = xmlReader->getAttributeValueSafe(XmlTag::RELS_ATTRIB_TYPE.c_str());
        relPtr->target = xmlReader->getAttributeValueSafe(XmlTag::RELS_ATTRIB_TARGET.c_str());
        if ( validateRels( relPtr ) ) {
            m_relationShips.push_back( relPtr );
        }
    }